

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::Parse
          (AsciiParser *this,uint32_t load_states,AsciiParserOption *parser_option)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  long primIdx;
  char *pcVar5;
  Specifier spec;
  Identifier tok;
  char c;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = (byte)load_states;
  this->_toplevel = (bool)(bVar2 & 1);
  this->_sub_layered = (bool)(bVar2 >> 1 & 1);
  this->_referenced = (bool)((byte)(load_states >> 2) & 1);
  this->_payloaded = (bool)(bVar2 >> 3 & 1);
  bVar3 = parser_option->allow_unknown_apiSchema;
  (this->_option).allow_unknown_prim = parser_option->allow_unknown_prim;
  (this->_option).allow_unknown_apiSchema = bVar3;
  (this->_option).strict_allowedToken_check = parser_option->strict_allowedToken_check;
  bVar3 = ParseMagicHeader(this);
  if (bVar3) {
    SkipCommentAndWhitespaceAndNewline(this,true);
    bVar3 = Eof(this);
    if (bVar3) {
      return true;
    }
    bVar3 = LookChar1(this,&c);
    if (!bVar3) {
      return false;
    }
    if ((c != '(') || (bVar3 = ParseStageMetas(this), bVar3)) {
      if ((this->_stage_meta_process_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"Parse");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x142e);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)&ss_e,"Stage metadata processing callback is not set."
                                  );
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::stringbuf::str();
        PushWarn(this,&tok.super_string);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      else {
        bVar3 = ::std::function<bool_(const_tinyusdz::ascii::AsciiParser::StageMetas_&)>::operator()
                          (&this->_stage_meta_process_fun,&this->_stage_metas);
        if (!bVar3) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"Parse");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x142a);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Failed to reconstruct Stage metas.";
          goto LAB_002a28ff;
        }
      }
      ::std::__cxx11::string::string((string *)&ss_e,"/",(allocator *)&tok);
      ::std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->_path_stack).c,(value_type *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      do {
        bVar3 = Eof(this);
        if (bVar3) {
          return true;
        }
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Eof(this);
        if (bVar3) {
          return true;
        }
        uVar1 = this->_sr->idx_;
        tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
        tok.super_string._M_string_length = 0;
        tok.super_string.field_2._M_local_buf[0] = '\0';
        bVar3 = ReadBasicType(this,&tok);
        if (!bVar3) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"Parse");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1443);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Identifier expected.\n";
LAB_002a2cc3:
          poVar4 = ::std::operator<<((ostream *)&ss_e,pcVar5);
          ::std::operator<<(poVar4,"\n");
LAB_002a2cda:
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&c);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002a2d07:
          ::std::__cxx11::string::_M_dispose();
          return false;
        }
        if (this->_sr->length_ < uVar1) goto LAB_002a2d07;
        this->_sr->idx_ = uVar1;
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tok,"def");
        spec = Def;
        if (!bVar3) {
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&tok,"over");
          spec = Over;
          if (bVar3) goto LAB_002a2b12;
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&tok,"class");
          spec = Class;
          if (bVar3) goto LAB_002a2b12;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"Parse");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1453);
          ::std::operator<<(poVar4," ");
          ::std::operator+(&local_50,"Invalid specifier token \'",&tok.super_string);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                           &local_50,"\'");
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&c);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002a2cda;
        }
LAB_002a2b12:
        primIdx = ::std::function<long_(long)>::operator()(&this->_prim_idx_assign_fun,-1);
        bVar3 = ParseBlock(this,spec,primIdx,-1,0,false);
        if (!bVar3) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"Parse");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x145c);
          ::std::operator<<(poVar4," ");
          pcVar5 = "Failed to parse `def` block.";
          goto LAB_002a2cc3;
        }
        ::std::__cxx11::string::_M_dispose();
      } while( true );
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"Parse");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1421);
    ::std::operator<<(poVar4," ");
    pcVar5 = "Failed to parse Stage metas.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"Parse");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x140e);
    ::std::operator<<(poVar4," ");
    pcVar5 = "Failed to parse USDA magic header.\n";
  }
LAB_002a28ff:
  poVar4 = ::std::operator<<((ostream *)&ss_e,pcVar5);
  ::std::operator<<(poVar4,"\n");
  ::std::__cxx11::stringbuf::str();
  PushError(this,&tok.super_string);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool AsciiParser::Parse(const uint32_t load_states,
                        const AsciiParserOption &parser_option) {
  _toplevel = (load_states & static_cast<uint32_t>(LoadState::Toplevel));
  _sub_layered = (load_states & static_cast<uint32_t>(LoadState::Sublayer));
  _referenced = (load_states & static_cast<uint32_t>(LoadState::Reference));
  _payloaded = (load_states & static_cast<uint32_t>(LoadState::Payload));
  _option = parser_option;

  bool header_ok = ParseMagicHeader();
  if (!header_ok) {
    PUSH_ERROR_AND_RETURN("Failed to parse USDA magic header.\n");
  }

  SkipCommentAndWhitespaceAndNewline();

  if (Eof()) {
    // Empty USDA
    return true;
  }

  {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // stage meta.
      if (!ParseStageMetas()) {
        PUSH_ERROR_AND_RETURN("Failed to parse Stage metas.");
      }
    }
  }

  if (_stage_meta_process_fun) {
    DCOUT("Invoke StageMeta callback.");
    bool ret = _stage_meta_process_fun(_stage_metas);
    if (!ret) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage metas.");
    }
  } else {
    // TODO: Report error when StageMeta callback is not set?
    PUSH_WARN("Stage metadata processing callback is not set.");
  }

  PushPrimPath("/");

  // parse blocks
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (Eof()) {
      // Whitespaces in the end of line.
      break;
    }

    // Look ahead token
    auto curr_loc = _sr->tell();

    Identifier tok;
    if (!ReadBasicType(&tok)) {
      PUSH_ERROR_AND_RETURN("Identifier expected.\n");
    }

    // Rewind
    if (!SeekTo(curr_loc)) {
      return false;
    }

    Specifier spec{Specifier::Invalid};
    if (tok == "def") {
      spec = Specifier::Def;
    } else if (tok == "over") {
      spec = Specifier::Over;
    } else if (tok == "class") {
      spec = Specifier::Class;
    } else {
      PUSH_ERROR_AND_RETURN("Invalid specifier token '" + tok + "'");
    }

    int64_t primIdx = _prim_idx_assign_fun(-1);
    DCOUT("Enter parseDef. primIdx = " << primIdx
                                       << ", parentPrimIdx = root(-1)");
    bool block_ok = ParseBlock(spec, primIdx, /* parent */ -1, /* depth */ 0,
                               /* in_variantStmt */ false);
    if (!block_ok) {
      PUSH_ERROR_AND_RETURN("Failed to parse `def` block.");
    }
  }

  return true;
}